

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

QString * regionTypeToUString(QString *__return_storage_ptr__,UINT8 type)

{
  undefined7 in_register_00000031;
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    psVar1 = (storage_type *)0xa;
    break;
  case 1:
    psVar1 = (storage_type *)0x4;
    break;
  case 2:
    goto LAB_001621c8;
  case 3:
    goto LAB_00162161;
  case 4:
    goto LAB_00162161;
  case 5:
    goto LAB_0016218c;
  case 6:
    psVar1 = (storage_type *)0x5;
    break;
  case 7:
    goto LAB_0016219d;
  case 8:
    goto LAB_001621c8;
  case 9:
LAB_0016218c:
    psVar1 = (storage_type *)0x7;
    break;
  case 10:
LAB_001621c8:
    psVar1 = (storage_type *)0x2;
    break;
  case 0xb:
    goto LAB_00162132;
  case 0xc:
LAB_00162132:
    psVar1 = (storage_type *)0x6;
    break;
  case 0xd:
    goto LAB_0016219d;
  case 0xe:
LAB_0016219d:
    psVar1 = (storage_type *)0x9;
    break;
  case 0xf:
LAB_00162161:
    psVar1 = (storage_type *)0x3;
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",type);
    return __return_storage_ptr__;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

UString regionTypeToUString(const UINT8 type)
{
    switch (type) {
        case Subtypes::DescriptorRegion:  return UString("Descriptor");
        case Subtypes::BiosRegion:        return UString("BIOS");
        case Subtypes::MeRegion:          return UString("ME");
        case Subtypes::GbeRegion:         return UString("GbE");
        case Subtypes::PdrRegion:         return UString("PDR");
        case Subtypes::DevExp1Region:     return UString("DevExp1");
        case Subtypes::Bios2Region:       return UString("BIOS2");
        case Subtypes::MicrocodeRegion:   return UString("Microcode");
        case Subtypes::EcRegion:          return UString("EC");
        case Subtypes::DevExp2Region:     return UString("DevExp2");
        case Subtypes::IeRegion:          return UString("IE");
        case Subtypes::Tgbe1Region:       return UString("10GbE1");
        case Subtypes::Tgbe2Region:       return UString("10GbE2");
        case Subtypes::Reserved1Region:   return UString("Reserved1");
        case Subtypes::Reserved2Region:   return UString("Reserved2");
        case Subtypes::PttRegion:         return UString("PTT");
    };
    
    return  usprintf("Unknown %02Xh", type);
}